

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bss_sock.c
# Opt level: O0

int sock_free(BIO *a)

{
  long in_RDI;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = 0;
  }
  else {
    if (*(int *)(in_RDI + 0x2c) != 0) {
      if (*(int *)(in_RDI + 0x28) != 0) {
        BIO_closesocket(0x21f63e);
      }
      *(undefined4 *)(in_RDI + 0x28) = 0;
      *(undefined4 *)(in_RDI + 0x30) = 0;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int sock_free(BIO *a)
{
    if (a == NULL)
        return 0;
    if (a->shutdown) {
        if (a->init) {
            BIO_closesocket(a->num);
        }
        a->init = 0;
        a->flags = 0;
    }
    return 1;
}